

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ics_impl.cpp
# Opt level: O2

void __thiscall ui::anon_unknown_0::ICSImpl::StoreConfig(ICSImpl *this)

{
  long lVar1;
  ostream *poVar2;
  char *pcVar3;
  time_t time_;
  ofstream config_file;
  byte abStack_1f0 [480];
  
  (anonymous_namespace)::BeagleConfigPath_abi_cxx11_();
  std::ofstream::ofstream(&config_file,(string *)&time_,_S_out);
  std::__cxx11::string::~string((string *)&time_);
  if ((abStack_1f0[*(long *)(_config_file + -0x18)] & 5) == 0) {
    lVar1 = std::chrono::_V2::system_clock::now();
    time_ = lVar1 / 1000000000;
    poVar2 = std::operator<<((ostream *)&config_file,"# Last Updated : ");
    pcVar3 = ctime(&time_);
    std::operator<<(poVar2,pcVar3);
    poVar2 = std::operator<<((ostream *)&config_file,"gateway=");
    poVar2 = std::operator<<(poVar2,(string *)&this->gateway_str);
    std::endl<char,std::char_traits<char>>(poVar2);
    poVar2 = std::operator<<((ostream *)&config_file,"dns1=");
    poVar2 = std::operator<<(poVar2,(string *)&this->dns_1_str);
    std::endl<char,std::char_traits<char>>(poVar2);
    poVar2 = std::operator<<((ostream *)&config_file,"dns2=");
    poVar2 = std::operator<<(poVar2,(string *)&this->dns_2_str);
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  std::ofstream::~ofstream(&config_file);
  return;
}

Assistant:

void StoreConfig() {
    std::ofstream config_file(BeagleConfigPath());
    if (!config_file) {
      return;
    }

    // Updating the current configuration and adding timestamp
    std::time_t time_ =
        std::chrono::system_clock::to_time_t(std::chrono::system_clock::now());

    config_file << "# Last Updated : " << std::ctime(&time_);
    config_file << "gateway=" << gateway_str << std::endl;
    config_file << "dns1=" << dns_1_str << std::endl;
    config_file << "dns2=" << dns_2_str << std::endl;
  }